

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblebridgeutils.cpp
# Opt level: O0

bool QAccessibleBridgeUtils::performEffectiveAction(QAccessibleInterface *iface,QString *actionName)

{
  bool bVar1;
  QAccessibleValueInterface *pQVar2;
  long in_RDI;
  long in_FS_OFFSET;
  double current;
  int typ;
  double max;
  double min;
  double stepSize;
  QAccessibleValueInterface *valueIface;
  bool success;
  QVariant currentVariant;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QString *in_stack_fffffffffffffed0;
  QAccessibleInterface *in_stack_fffffffffffffed8;
  bool local_aa;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    local_aa = false;
  }
  else {
    bVar1 = performAction(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    if (bVar1) {
      local_aa = true;
    }
    else {
      QAccessibleActionInterface::increaseAction();
      bVar1 = ::operator!=(in_stack_fffffffffffffed0,
                           (QString *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8))
      ;
      if (bVar1) {
        QAccessibleActionInterface::decreaseAction();
        bVar1 = ::operator!=(in_stack_fffffffffffffed0,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        if (bVar1) {
          local_aa = false;
          goto LAB_009667e9;
        }
      }
      pQVar2 = QAccessibleInterface::valueInterface((QAccessibleInterface *)0x966514);
      if (pQVar2 == (QAccessibleValueInterface *)0x0) {
        local_aa = false;
      }
      else {
        local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        (*pQVar2->_vptr_QAccessibleValueInterface[2])(&local_28);
        (*pQVar2->_vptr_QAccessibleValueInterface[6])(&local_48);
        ::QVariant::toDouble((bool *)&local_48);
        ::QVariant::~QVariant(&local_48);
        (*pQVar2->_vptr_QAccessibleValueInterface[5])(&local_68);
        ::QVariant::toDouble((bool *)&local_68);
        ::QVariant::~QVariant(&local_68);
        local_aa = false;
        ::QVariant::~QVariant((QVariant *)&local_28);
      }
    }
  }
LAB_009667e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_aa;
  }
  __stack_chk_fail();
}

Assistant:

bool performEffectiveAction(QAccessibleInterface *iface, const QString &actionName)
{
    if (!iface)
        return false;
    if (performAction(iface, actionName))
        return true;
    if (actionName != QAccessibleActionInterface::increaseAction()
        && actionName != QAccessibleActionInterface::decreaseAction())
        return false;

    QAccessibleValueInterface *valueIface = iface->valueInterface();
    if (!valueIface)
        return false;
    bool success;
    const QVariant currentVariant = valueIface->currentValue();
    double stepSize = valueIface->minimumStepSize().toDouble(&success);
    if (!success || qFuzzyIsNull(stepSize)) {
        const double min = valueIface->minimumValue().toDouble(&success);
        if (!success)
            return false;
        const double max = valueIface->maximumValue().toDouble(&success);
        if (!success)
            return false;
        stepSize = (max - min) / 10;  // this is pretty arbitrary, we just need to provide something
        const int typ = currentVariant.userType();
        if (typ != QMetaType::Float && typ != QMetaType::Double) {
            // currentValue is an integer. Round it up to ensure stepping in case it was below 1
            stepSize = qCeil(stepSize);
        }
    }
    const double current = currentVariant.toDouble(&success);
    if (!success)
        return false;
    if (actionName == QAccessibleActionInterface::decreaseAction())
        stepSize = -stepSize;
    valueIface->setCurrentValue(current + stepSize);
    return true;
}